

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O1

void __thiscall Controller::HandleInput(Controller *this,bool *running,Snake *snake)

{
  int iVar1;
  SDL_Event e;
  int local_60 [5];
  undefined4 local_4c;
  
  iVar1 = SDL_PollEvent(local_60);
  if (iVar1 != 0) {
    do {
      if (local_60[0] == 0x300) {
        switch(local_4c) {
        case 0x4000004f:
          if ((snake->direction != kLeft) || (snake->size == 1)) {
            snake->direction = kRight;
          }
          break;
        case 0x40000050:
          if ((snake->direction != kRight) || (snake->size == 1)) {
            snake->direction = kLeft;
          }
          break;
        case 0x40000051:
          if ((snake->direction != kUp) || (snake->size == 1)) {
            snake->direction = kDown;
          }
          break;
        case 0x40000052:
          if ((snake->direction != kDown) || (snake->size == 1)) {
            snake->direction = kUp;
          }
        }
      }
      else if (local_60[0] == 0x100) {
        *running = false;
      }
      iVar1 = SDL_PollEvent(local_60);
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void Controller::HandleInput(bool &running, Snake &snake) const {
  SDL_Event e;
  while (SDL_PollEvent(&e)) {
    if (e.type == SDL_QUIT) {
      running = false;
    } else if (e.type == SDL_KEYDOWN) {
      switch (e.key.keysym.sym) {
        case SDLK_UP:
          ChangeDirection(snake, Snake::Direction::kUp,
                          Snake::Direction::kDown);
          break;

        case SDLK_DOWN:
          ChangeDirection(snake, Snake::Direction::kDown,
                          Snake::Direction::kUp);
          break;

        case SDLK_LEFT:
          ChangeDirection(snake, Snake::Direction::kLeft,
                          Snake::Direction::kRight);
          break;

        case SDLK_RIGHT:
          ChangeDirection(snake, Snake::Direction::kRight,
                          Snake::Direction::kLeft);
          break;
      }
    }
  }
}